

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O3

bool __thiscall cmCTestGIT::LoadModifications(cmCTestGIT *this)

{
  pointer pcVar1;
  pointer pCVar2;
  pointer pCVar3;
  long *plVar4;
  Change *c;
  long lVar5;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  string git;
  DiffParser out;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  git_diff_index;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  git_update_index;
  OutputLogger err;
  OutputLogger ui_out;
  OutputLogger ui_err;
  long *local_220;
  long local_218;
  long local_210 [2];
  string local_200;
  string local_1e0;
  undefined1 local_1c0 [32];
  char *local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  undefined1 local_180 [32];
  _Alloc_hider *local_160 [2];
  _Alloc_hider local_150 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  long local_130 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_120;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  OutputLogger local_f0;
  OutputLogger local_b0;
  OutputLogger local_70;
  
  local_220 = local_210;
  pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_220,pcVar1,
             pcVar1 + (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_string_length
            );
  local_1c0._0_8_ = local_1c0 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1c0,local_220,local_218 + (long)local_220);
  local_1a0 = local_198._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"update-index","");
  pCVar3 = (pointer)(local_180 + 0x10);
  local_180._0_8_ = pCVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"--refresh","");
  __l._M_len = 3;
  __l._M_array = (iterator)local_1c0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_108,__l,(allocator_type *)&local_b0);
  lVar5 = -0x60;
  do {
    pCVar2 = (pointer)pCVar3[-1].Path.field_2._M_allocated_capacity;
    if (pCVar3 != pCVar2) {
      operator_delete(pCVar2,*(long *)pCVar3 + 1);
    }
    pCVar3 = (pointer)&pCVar3[-1].Path;
    lVar5 = lVar5 + 0x20;
  } while (lVar5 != 0);
  cmProcessTools::OutputLogger::OutputLogger
            (&local_b0,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"ui-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            (&local_70,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"ui-err> ");
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"");
  cmCTestVC::RunChild((cmCTestVC *)this,&local_108,(OutputParser *)&local_b0,
                      (OutputParser *)&local_70,&local_1e0,UTF8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  local_1c0._0_8_ = local_1c0 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1c0,local_220,local_218 + (long)local_220);
  local_1a0 = local_198._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"diff-index","");
  local_180._0_8_ = local_180 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"-z","");
  local_160[0] = local_150;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"HEAD","");
  plVar4 = local_130;
  local_140._M_allocated_capacity = (size_type)plVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"--","");
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)local_1c0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120,__l_00,(allocator_type *)&local_f0);
  lVar5 = -0xa0;
  do {
    if (plVar4 != (long *)plVar4[-2]) {
      operator_delete((long *)plVar4[-2],*plVar4 + 1);
    }
    plVar4 = plVar4 + -4;
    lVar5 = lVar5 + 0x20;
  } while (lVar5 != 0);
  DiffParser::DiffParser((DiffParser *)local_1c0,this,"di-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            (&local_f0,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"di-err> ");
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"");
  cmCTestVC::RunChild((cmCTestVC *)this,&local_120,(OutputParser *)local_1c0,
                      (OutputParser *)&local_f0,&local_200,UTF8);
  pCVar3 = (pointer)local_180._0_8_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    pCVar3 = (pointer)local_180._0_8_;
  }
  for (; pCVar3 != (pointer)local_180._8_8_; pCVar3 = pCVar3 + 1) {
    (*(this->super_cmCTestGlobalVC).super_cmCTestVC._vptr_cmCTestVC[10])(this,1,&pCVar3->Path);
  }
  local_f0.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_00bbdac8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.super_LineParser.Line._M_dataplus._M_p != &local_f0.super_LineParser.Line.field_2)
  {
    operator_delete(local_f0.super_LineParser.Line._M_dataplus._M_p,
                    local_f0.super_LineParser.Line.field_2._M_allocated_capacity + 1);
  }
  local_1c0._0_8_ = &PTR__DiffParser_00bba410;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150[0]._M_p != &local_140) {
    operator_delete(local_150[0]._M_p,local_140._M_allocated_capacity + 1);
  }
  std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::~vector
            ((vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_> *)local_180)
  ;
  local_1c0._0_8_ = &PTR__LineParser_00bbdac8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._24_8_ != &local_198) {
    operator_delete((void *)local_1c0._24_8_,local_198._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_120);
  local_70.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_00bbdac8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.super_LineParser.Line._M_dataplus._M_p != &local_70.super_LineParser.Line.field_2)
  {
    operator_delete(local_70.super_LineParser.Line._M_dataplus._M_p,
                    local_70.super_LineParser.Line.field_2._M_allocated_capacity + 1);
  }
  local_b0.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_00bbdac8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.super_LineParser.Line._M_dataplus._M_p != &local_b0.super_LineParser.Line.field_2)
  {
    operator_delete(local_b0.super_LineParser.Line._M_dataplus._M_p,
                    local_b0.super_LineParser.Line.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_108);
  if (local_220 != local_210) {
    operator_delete(local_220,local_210[0] + 1);
  }
  return true;
}

Assistant:

bool cmCTestGIT::LoadModifications()
{
  std::string git = this->CommandLineTool;

  // Use 'git update-index' to refresh the index w.r.t. the work tree.
  std::vector<std::string> git_update_index = { git, "update-index",
                                                "--refresh" };
  OutputLogger ui_out(this->Log, "ui-out> ");
  OutputLogger ui_err(this->Log, "ui-err> ");
  this->RunChild(git_update_index, &ui_out, &ui_err, "",
                 cmProcessOutput::UTF8);

  // Use 'git diff-index' to get modified files.
  std::vector<std::string> git_diff_index = { git, "diff-index", "-z", "HEAD",
                                              "--" };
  DiffParser out(this, "di-out> ");
  OutputLogger err(this->Log, "di-err> ");
  this->RunChild(git_diff_index, &out, &err, "", cmProcessOutput::UTF8);

  for (Change const& c : out.Changes) {
    this->DoModification(PathModified, c.Path);
  }
  return true;
}